

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O1

int Aig_ManRemapRepr(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t **ppAVar5;
  Aig_Obj_t *pAVar6;
  int iVar7;
  long lVar8;
  Vec_Ptr_t *pVVar9;
  Aig_Obj_t *pAVar10;
  
  pVVar9 = p->vObjs;
  if (pVVar9->nSize < 1) {
    iVar7 = 0;
  }
  else {
    lVar8 = 0;
    iVar7 = 0;
    do {
      pAVar4 = (Aig_Obj_t *)pVVar9->pArray[lVar8];
      if ((pAVar4 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar4->field_0x18 & 7) - 7)) {
        ppAVar5 = p->pReprs;
        if (ppAVar5 == (Aig_Obj_t **)0x0) {
          __assert_fail("p->pReprs != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigRepr.c"
                        ,0x85,"Aig_Obj_t *Aig_ObjFindRepr(Aig_Man_t *, Aig_Obj_t *)");
        }
        if (((ulong)pAVar4 & 1) != 0) {
LAB_006c9e3f:
          __assert_fail("!Aig_IsComplement(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigRepr.c"
                        ,0x86,"Aig_Obj_t *Aig_ObjFindRepr(Aig_Man_t *, Aig_Obj_t *)");
        }
        iVar1 = pAVar4->Id;
        iVar2 = p->nReprsAlloc;
        if (iVar2 <= iVar1) {
LAB_006c9e5e:
          __assert_fail("pNode->Id < p->nReprsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigRepr.c"
                        ,0x87,"Aig_Obj_t *Aig_ObjFindRepr(Aig_Man_t *, Aig_Obj_t *)");
        }
        pAVar6 = ppAVar5[iVar1];
        if (ppAVar5[iVar1] == (Aig_Obj_t *)0x0) {
          pAVar10 = (Aig_Obj_t *)0x0;
        }
        else {
          do {
            pAVar10 = pAVar6;
            if (((ulong)pAVar10 & 1) != 0) goto LAB_006c9e3f;
            if (iVar2 <= pAVar10->Id) goto LAB_006c9e5e;
            pAVar6 = ppAVar5[pAVar10->Id];
          } while (ppAVar5[pAVar10->Id] != (Aig_Obj_t *)0x0);
        }
        if (pAVar10 != (Aig_Obj_t *)0x0) {
          iVar3 = pAVar10->Id;
          if (iVar1 <= iVar3) {
            __assert_fail("pRepr->Id < pObj->Id",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigRepr.c"
                          ,0x168,"int Aig_ManRemapRepr(Aig_Man_t *)");
          }
          if (iVar2 <= iVar3) {
            __assert_fail("pNode2->Id < p->nReprsAlloc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigRepr.c"
                          ,0x6f,"void Aig_ObjSetRepr_(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
          }
          if (pAVar4 != pAVar10) {
            if (iVar1 < iVar3) {
              ppAVar5[iVar3] = pAVar4;
            }
            else {
              ppAVar5[iVar1] = pAVar10;
            }
          }
          iVar7 = (iVar7 + 1) - (uint)((*(uint *)&pAVar4->field_0x18 & 0xffffffc0) == 0);
        }
      }
      lVar8 = lVar8 + 1;
      pVVar9 = p->vObjs;
    } while (lVar8 < pVVar9->nSize);
  }
  return iVar7;
}

Assistant:

int Aig_ManRemapRepr( Aig_Man_t * p )
{
    Aig_Obj_t * pObj, * pRepr;
    int i, nFanouts = 0;
    Aig_ManForEachNode( p, pObj, i )
    {
        pRepr = Aig_ObjFindReprTransitive( p, pObj );
        if ( pRepr == NULL )
            continue;
        assert( pRepr->Id < pObj->Id );
        Aig_ObjSetRepr_( p, pObj, pRepr );
        nFanouts += (pObj->nRefs > 0);
    }
    return nFanouts;
}